

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_deflate(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  size_t *psVar1;
  ushort uVar2;
  zip *zip;
  long lVar3;
  wchar_t wVar4;
  uint uVar5;
  uchar *puVar6;
  uint8_t *in;
  uint8_t *out;
  char *fmt;
  uchar *in_len;
  int error_number;
  ssize_t bytes_avail;
  size_t dsize;
  uchar *local_40;
  uchar *local_38;
  
  zip = (zip *)a->format->data;
  if (zip->uncompressed_buffer == (uchar *)0x0) {
    zip->uncompressed_buffer_size = 0x40000;
    puVar6 = (uchar *)malloc(0x40000);
    zip->uncompressed_buffer = puVar6;
    if (puVar6 != (uchar *)0x0) goto LAB_0015f06d;
    fmt = "No memory for ZIP decompression";
  }
  else {
LAB_0015f06d:
    wVar4 = zip_deflate_init(a,zip);
    if (wVar4 != L'\0') {
      return wVar4;
    }
    in = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_40);
    uVar2 = zip->entry->zip_flags;
    if (((uVar2 & 8) == 0) && ((long)zip->entry_bytes_remaining < (long)local_40)) {
      local_40 = (uchar *)zip->entry_bytes_remaining;
    }
    if ((long)local_40 < 0) {
      fmt = "Truncated ZIP file body";
      error_number = 0x54;
      goto LAB_0015f251;
    }
    if ((zip->tctx_valid != '\0') || (puVar6 = in, zip->cctx_valid != '\0')) {
      puVar6 = (uchar *)zip->decrypted_bytes_remaining;
      if (puVar6 < local_40) {
        out = zip->decrypted_ptr + (long)puVar6;
        in_len = zip->decrypted_buffer + (zip->decrypted_buffer_size - (long)out);
        if (local_40 <= zip->decrypted_buffer + (zip->decrypted_buffer_size - (long)out)) {
          in_len = local_40;
        }
        if ((((uVar2 & 8) == 0) && (lVar3 = zip->entry_bytes_remaining, 0 < lVar3)) &&
           (lVar3 < (long)(puVar6 + (long)in_len))) {
          in_len = (uchar *)0x0;
          if ((long)puVar6 <= lVar3) {
            in_len = (uchar *)(lVar3 - (long)puVar6);
          }
        }
        if (in_len != (uchar *)0x0) {
          if (zip->tctx_valid == '\0') {
            local_38 = in_len;
            aes_ctr_update(&zip->cctx,in,(size_t)in_len,out,(size_t *)&local_38);
          }
          else {
            trad_enc_decrypt_update(&zip->tctx,in,(size_t)in_len,out,(size_t)in_len);
          }
          zip->decrypted_bytes_remaining = (size_t)(in_len + zip->decrypted_bytes_remaining);
        }
      }
      local_40 = (uchar *)zip->decrypted_bytes_remaining;
      puVar6 = zip->decrypted_ptr;
    }
    (zip->stream).next_in = puVar6;
    (zip->stream).avail_in = (uInt)local_40;
    (zip->stream).total_in = 0;
    (zip->stream).next_out = zip->uncompressed_buffer;
    (zip->stream).avail_out = (uInt)zip->uncompressed_buffer_size;
    (zip->stream).total_out = 0;
    uVar5 = cm_zlib_inflate(&zip->stream,0);
    if (uVar5 != 0xfffffffc) {
      if (uVar5 != 0) {
        if (uVar5 != 1) {
          archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)",(ulong)uVar5);
          return L'\xffffffe2';
        }
        zip->end_of_entry = '\x01';
      }
      local_40 = (uchar *)(zip->stream).total_in;
      if ((zip->tctx_valid != '\0') || (zip->cctx_valid != '\0')) {
        psVar1 = &zip->decrypted_bytes_remaining;
        *psVar1 = *psVar1 - (long)local_40;
        if (*psVar1 == 0) {
          zip->decrypted_ptr = zip->decrypted_buffer;
        }
        else {
          zip->decrypted_ptr = zip->decrypted_ptr + (long)local_40;
        }
      }
      if (zip->hctx_valid != '\0') {
        __hmac_sha1_update(&zip->hctx,in,(size_t)local_40);
      }
      __archive_read_consume(a,(int64_t)local_40);
      zip->entry_bytes_remaining = zip->entry_bytes_remaining - (long)local_40;
      zip->entry_compressed_bytes_read = (int64_t)(local_40 + zip->entry_compressed_bytes_read);
      *size = (zip->stream).total_out;
      zip->entry_uncompressed_bytes_read =
           zip->entry_uncompressed_bytes_read + (zip->stream).total_out;
      *buff = zip->uncompressed_buffer;
      if (((zip->end_of_entry != '\0') && (zip->hctx_valid != '\0')) &&
         (wVar4 = check_authentication_code(a,(void *)0x0), wVar4 != L'\0')) {
        return wVar4;
      }
      wVar4 = consume_optional_marker(a,zip);
      return wVar4;
    }
    fmt = "Out of memory for ZIP decompression";
  }
  error_number = 0xc;
LAB_0015f251:
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_deflate(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	ssize_t bytes_avail;
	const void *compressed_buff, *sp;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = 256 * 1024;
		zip->uncompressed_buffer
		    = (unsigned char *)malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decompression");
			return (ARCHIVE_FATAL);
		}
	}

	r = zip_deflate_init(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	compressed_buff = sp = __archive_read_ahead(a, 1, &bytes_avail);
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && bytes_avail > zip->entry_bytes_remaining) {
		bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file body");
		return (ARCHIVE_FATAL);
	}

	if (zip->tctx_valid || zip->cctx_valid) {
		if (zip->decrypted_bytes_remaining < (size_t)bytes_avail) {
			size_t buff_remaining =
			    (zip->decrypted_buffer +
			    zip->decrypted_buffer_size)
			    - (zip->decrypted_ptr +
			    zip->decrypted_bytes_remaining);

			if (buff_remaining > (size_t)bytes_avail)
				buff_remaining = (size_t)bytes_avail;

			if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END) &&
			      zip->entry_bytes_remaining > 0) {
				if ((int64_t)(zip->decrypted_bytes_remaining
				    + buff_remaining)
				      > zip->entry_bytes_remaining) {
					if (zip->entry_bytes_remaining <
					    (int64_t)zip->decrypted_bytes_remaining)
						buff_remaining = 0;
					else
						buff_remaining =
						    (size_t)zip->entry_bytes_remaining
						    - zip->decrypted_bytes_remaining;
				}
			}
			if (buff_remaining > 0) {
				if (zip->tctx_valid) {
					trad_enc_decrypt_update(&zip->tctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    buff_remaining);
				} else {
					size_t dsize = buff_remaining;
					archive_decrypto_aes_ctr_update(
					    &zip->cctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    &dsize);
				}
				zip->decrypted_bytes_remaining +=
				    buff_remaining;
			}
		}
		bytes_avail = zip->decrypted_bytes_remaining;
		compressed_buff = (const char *)zip->decrypted_ptr;
	}

	/*
	 * A bug in zlib.h: stream.next_in should be marked 'const'
	 * but isn't (the library never alters data through the
	 * next_in pointer, only reads it).  The result: this ugly
	 * cast to remove 'const'.
	 */
	zip->stream.next_in = (Bytef *)(uintptr_t)(const void *)compressed_buff;
	zip->stream.avail_in = (uInt)bytes_avail;
	zip->stream.total_in = 0;
	zip->stream.next_out = zip->uncompressed_buffer;
	zip->stream.avail_out = (uInt)zip->uncompressed_buffer_size;
	zip->stream.total_out = 0;

	r = inflate(&zip->stream, 0);
	switch (r) {
	case Z_OK:
		break;
	case Z_STREAM_END:
		zip->end_of_entry = 1;
		break;
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for ZIP decompression");
		return (ARCHIVE_FATAL);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "ZIP decompression failed (%d)", r);
		return (ARCHIVE_FATAL);
	}

	/* Consume as much as the compressor actually used. */
	bytes_avail = zip->stream.total_in;
	if (zip->tctx_valid || zip->cctx_valid) {
		zip->decrypted_bytes_remaining -= bytes_avail;
		if (zip->decrypted_bytes_remaining == 0)
			zip->decrypted_ptr = zip->decrypted_buffer;
		else
			zip->decrypted_ptr += bytes_avail;
	}
	/* Calculate compressed data as much as we used.*/
	if (zip->hctx_valid)
		archive_hmac_sha1_update(&zip->hctx, sp, bytes_avail);
	__archive_read_consume(a, bytes_avail);
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;

	*size = zip->stream.total_out;
	zip->entry_uncompressed_bytes_read += zip->stream.total_out;
	*buff = zip->uncompressed_buffer;

	if (zip->end_of_entry && zip->hctx_valid) {
		r = check_authentication_code(a, NULL);
		if (r != ARCHIVE_OK)
			return (r);
	}

	r = consume_optional_marker(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	return (ARCHIVE_OK);
}